

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O3

errr finish_parse_ui_entry_renderer(parser *p)

{
  char *name;
  renderer_info *prVar1;
  wchar_t wVar2;
  int iVar3;
  size_t sVar4;
  void *__dest;
  long lVar5;
  renderer_info *prVar6;
  long lVar7;
  long lVar8;
  wchar_t defsym [64];
  wchar_t local_138 [66];
  
  if (L'\0' < renderer_count) {
    lVar8 = 0;
    lVar7 = 0;
    prVar6 = renderers;
    do {
      name = *(char **)((long)&prVar6->comb_rend_nm + lVar8);
      if (name != (char *)0x0) {
        wVar2 = ui_entry_renderer_lookup(name);
        *(wchar_t *)((long)&prVar6->combined_renderer_index + lVar8) = wVar2;
        string_free(name);
        prVar6 = renderers;
        *(undefined8 *)((long)&renderers->comb_rend_nm + lVar8) = 0;
      }
      lVar5 = *(long *)((long)&prVar6->backend + lVar8);
      if (lVar5 != 0) {
        if (*(int *)((long)&prVar6->combiner_index + lVar8) == 0) {
          iVar3 = ui_entry_combiner_lookup(*(char **)(lVar5 + 0x10));
          prVar6 = renderers;
          *(int *)((long)&renderers->combiner_index + lVar8) = iVar3;
          if (iVar3 == 0) {
            __assert_fail("renderers[i].combiner_index != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                          ,0x754,"errr finish_parse_ui_entry_renderer(struct parser *)");
          }
          lVar5 = *(long *)((long)&prVar6->backend + lVar8);
        }
        augment_colors(*(char **)(lVar5 + 0x18),(int **)((long)&prVar6->colors + lVar8),
                       (int *)((long)&prVar6->ncolors + lVar8));
        augment_colors(*(char **)(*(long *)((long)&renderers->backend + lVar8) + 0x20),
                       (int **)((long)&renderers->label_colors + lVar8),
                       (int *)((long)&renderers->nlabcolors + lVar8));
        prVar1 = renderers;
        sVar4 = text_mbstowcs(local_138,
                              *(char **)(*(long *)((long)&renderers->backend + lVar8) + 0x28),L'@');
        if (sVar4 == 0xffffffffffffffff) {
          quit("Invalid encoding for default symbols");
        }
        iVar3 = (int)sVar4;
        prVar6 = renderers;
        if (*(int *)((long)&prVar1->nsym + lVar8) < iVar3) {
          __dest = mem_alloc(sVar4 * 4 + 4);
          lVar5 = (long)*(int *)((long)&prVar1->nsym + lVar8);
          if (0 < lVar5) {
            memcpy(__dest,*(void **)((long)&prVar1->symbols + lVar8),lVar5 << 2);
          }
          mem_free(*(void **)((long)&prVar1->symbols + lVar8));
          lVar5 = (long)*(int *)((long)&prVar1->nsym + lVar8);
          memcpy((void *)(lVar5 * 4 + (long)__dest),local_138 + lVar5,(iVar3 - lVar5) * 4);
          sVar4 = text_mbstowcs((wchar_t *)(sVar4 * 4 + (long)__dest),"",L'\x01');
          if (sVar4 == 0xffffffffffffffff) {
            quit("Couldn\'t terminate null character string");
          }
          *(int *)((long)&prVar1->nsym + lVar8) = iVar3;
          *(void **)((long)&prVar1->symbols + lVar8) = __dest;
          prVar6 = renderers;
        }
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x58;
    } while (lVar7 < renderer_count);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_ui_entry_renderer(struct parser *p)
{
	int i;

	for (i = 0; i < renderer_count; ++i) {
		/* Get the combined value renderer. */
		if (renderers[i].comb_rend_nm) {
			renderers[i].combined_renderer_index =
				ui_entry_renderer_lookup(renderers[i].comb_rend_nm);
			string_free(renderers[i].comb_rend_nm);
			renderers[i].comb_rend_nm = NULL;
		}

		if (!renderers[i].backend) {
			continue;
		}

		/* Use the default combiner if nothing was set. */
		if (!renderers[i].combiner_index) {
			renderers[i].combiner_index = ui_entry_combiner_lookup(
				renderers[i].backend->default_combiner_name);
			assert(renderers[i].combiner_index != 0);
		}

		/*
		 * If have fewer colors or symbols than the defaults for the
		 * backend, augment what was set with the default values.
		 */
		augment_colors(renderers[i].backend->default_colors,
			&renderers[i].colors, &renderers[i].ncolors);
		augment_colors(renderers[i].backend->default_labelcolors,
			&renderers[i].label_colors, &renderers[i].nlabcolors);
		augment_symbols(renderers[i].backend->default_symbols,
			&renderers[i].symbols, &renderers[i].nsym);

		if (renderers[i].ndigit == INT_MIN) {
			renderers[i].ndigit =
				renderers[i].backend->default_ndigit;
		}
		if (renderers[i].sign == UI_ENTRY_SIGN_DEFAULT) {
			renderers[i].sign =
				renderers[i].backend->default_sign;
		}
	}
	parser_destroy(p);
	return 0;
}